

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_flttointeger(lua_Number n,lua_Integer *p,F2Imod mode)

{
  double dVar1;
  bool bVar2;
  
  dVar1 = floor(n);
  if ((dVar1 != n) || (NAN(dVar1) || NAN(n))) {
    if (mode == F2Ieq) {
      return 0;
    }
    if (mode == F2Iceil) {
      dVar1 = dVar1 + 1.0;
    }
  }
  bVar2 = -9.223372036854776e+18 <= dVar1 && dVar1 < 9.223372036854776e+18;
  if (bVar2) {
    *p = (long)dVar1;
  }
  return (uint)bVar2;
}

Assistant:

int luaV_flttointeger (lua_Number n, lua_Integer *p, F2Imod mode) {
  lua_Number f = l_floor(n);
  if (n != f) {  /* not an integral value? */
    if (mode == F2Ieq) return 0;  /* fails if mode demands integral value */
    else if (mode == F2Iceil)  /* needs ceil? */
      f += 1;  /* convert floor to ceil (remember: n != f) */
  }
  return lua_numbertointeger(f, p);
}